

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

RefAST __thiscall antlr::ASTFactory::create(ASTFactory *this,RefAST *tr)

{
  int iVar1;
  AST *pAVar2;
  reference pppVar3;
  ASTRefCount *in_RDX;
  long in_RSI;
  ASTRef *in_RDI;
  RefAST *t;
  ASTRef *this_00;
  undefined1 local_38 [31];
  undefined1 local_19;
  
  this_00 = in_RDI;
  pAVar2 = ASTRefCount::operator_cast_to_AST_(in_RDX);
  if (pAVar2 == (AST *)0x0) {
    ASTRefCount<antlr::AST>::ASTRefCount
              ((ASTRefCount<antlr::AST> *)this_00,(ASTRefCount<antlr::AST> *)in_RDX);
  }
  else {
    local_19 = 0;
    pAVar2 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RDX);
    iVar1 = (*pAVar2->_vptr_AST[0x10])();
    pppVar3 = std::
              vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
              ::operator[]((vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
                            *)(in_RSI + 0x18),(long)iVar1);
    (*(*pppVar3)->second)(this_00);
    pAVar2 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)this_00);
    ASTRefCount<antlr::AST>::ASTRefCount
              ((ASTRefCount<antlr::AST> *)this_00,(ASTRefCount<antlr::AST> *)in_RDX);
    (*pAVar2->_vptr_AST[0x12])(pAVar2,local_38);
    ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)this_00);
  }
  return (RefAST)in_RDI;
}

Assistant:

RefAST ASTFactory::create(RefAST tr)
{
	if (!tr)
		return nullAST;

//	cout << "create(tr)" << endl;

	RefAST t = nodeFactories[tr->getType()]->second();
	t->initialize(tr);
	return t;
}